

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YedisCommand.cpp
# Opt level: O0

bool __thiscall Yedis::YCommand::addCommand(YCommand *this,string *cmd,YedisCommand *command)

{
  ulong uVar1;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_YedisCommand_*>_&&>::value,_pair<iterator,_bool>_>
  _Var2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Yedis::YedisCommand_*>
  local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Yedis::YedisCommand_*>,_true>
  local_38;
  byte local_30;
  YedisCommand *local_28;
  YedisCommand *command_local;
  string *cmd_local;
  YCommand *this_local;
  
  local_28 = command;
  command_local = (YedisCommand *)cmd;
  cmd_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::make_pair<std::__cxx11::string_const&,Yedis::YedisCommand_const*&>
              (&local_60,&command_local->cmd,&local_28);
    _Var2 = std::
            unordered_map<std::__cxx11::string,Yedis::YedisCommand_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Yedis::YedisCommand_const*>>>
            ::insert<std::pair<std::__cxx11::string,Yedis::YedisCommand_const*>>
                      ((unordered_map<std::__cxx11::string,Yedis::YedisCommand_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Yedis::YedisCommand_const*>>>
                        *)this,&local_60);
    local_38._M_cur =
         (__node_type *)
         _Var2.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Yedis::YedisCommand_*>,_true>
         ._M_cur;
    local_30 = _Var2.second;
    this_local._7_1_ = local_30 & 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Yedis::YedisCommand_*>
    ::~pair(&local_60);
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool YCommand::addCommand(const std::string& cmd, const YedisCommand* command)
{
    if(cmd.empty())
    {
        return true;
    }

    return m_cmdInfo.insert(std::make_pair(cmd,command)).second;
}